

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O2

int print_reasons(BIO *out,char *rname,ASN1_BIT_STRING *rflags,int indent)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  
  BIO_printf((BIO *)out,"%*s%s:\n%*s",(ulong)(uint)indent,"",rname,(ulong)(indent + 2),"");
  bVar1 = true;
  ppcVar4 = &reason_flags[0].lname;
  while( true ) {
    pcVar3 = *ppcVar4;
    if (pcVar3 == (char *)0x0) break;
    iVar2 = ASN1_BIT_STRING_get_bit
                      ((ASN1_BIT_STRING *)rflags,((BIT_STRING_BITNAME *)(ppcVar4 + -1))->bitnum);
    if (iVar2 != 0) {
      if (!bVar1) {
        BIO_puts((BIO *)out,", ");
      }
      BIO_puts((BIO *)out,pcVar3);
      bVar1 = false;
    }
    ppcVar4 = ppcVar4 + 3;
  }
  pcVar3 = "<EMPTY>\n";
  if (!bVar1) {
    pcVar3 = "\n";
  }
  iVar2 = BIO_puts((BIO *)out,pcVar3);
  return iVar2;
}

Assistant:

static int print_reasons(BIO *out, const char *rname, ASN1_BIT_STRING *rflags,
                         int indent) {
  int first = 1;
  const BIT_STRING_BITNAME *pbn;
  BIO_printf(out, "%*s%s:\n%*s", indent, "", rname, indent + 2, "");
  for (pbn = reason_flags; pbn->lname; pbn++) {
    if (ASN1_BIT_STRING_get_bit(rflags, pbn->bitnum)) {
      if (first) {
        first = 0;
      } else {
        BIO_puts(out, ", ");
      }
      BIO_puts(out, pbn->lname);
    }
  }
  if (first) {
    BIO_puts(out, "<EMPTY>\n");
  } else {
    BIO_puts(out, "\n");
  }
  return 1;
}